

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O1

void __thiscall QApplicationPrivate::initialize(QApplicationPrivate *this)

{
  int *piVar1;
  char cVar2;
  int iVar3;
  QStyle *style;
  long in_FS_OFFSET;
  QLatin1String QVar4;
  QArrayDataPointer<QString> QStack_b8;
  QArrayData *local_a0;
  longlong local_98;
  QArrayData *local_88;
  undefined8 *local_80;
  QArrayData *local_70;
  undefined8 *local_68;
  anon_union_24_3_e3d07ef4_for_data local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QCoreApplicationPrivate::is_app_running._0_1_ = 0;
  QWidgetPrivate::mapper = (QWidgetMapper *)operator_new(8);
  QWidgetPrivate::mapper->d = (Data *)0x0;
  QWidgetPrivate::allWidgets = (QWidgetSet *)operator_new(8);
  (QWidgetPrivate::allWidgets->q_hash).d = (Data *)0x0;
  qRegisterWidgetsVariant();
  QAbstractDeclarativeData::setWidgetParent = QWidgetPrivate::setWidgetParentHelper;
  if (this->field_0x90 != '\0') {
    if (_topLevelAt != 0) {
      QString::toLower_helper((QString *)local_58.data);
      style = QStyleFactory::create((QString *)&local_58);
      piVar1 = (int *)CONCAT44(local_58._4_4_,local_58._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_58._4_4_,local_58._0_4_),2,0x10);
        }
      }
      if (style == (QStyle *)0x0) {
        local_58._0_4_ = 2;
        local_58._4_4_ = 0;
        local_58._8_4_ = 0;
        local_58._12_8_ = 0;
        local_58._20_4_ = 0;
        local_40 = "default";
        QString::toLocal8Bit_helper((QChar *)&local_70,_create);
        if (local_68 == (undefined8 *)0x0) {
          local_68 = &QByteArray::_empty;
        }
        QStyleFactory::keys();
        QVar4.m_data = (char *)0x2;
        QVar4.m_size = (qsizetype)&QStack_b8;
        QtPrivate::QStringList_join((QList_conflict *)&local_a0,QVar4);
        QString::toLocal8Bit_helper((QChar *)&local_88,local_98);
        if (local_80 == (undefined8 *)0x0) {
          local_80 = &QByteArray::_empty;
        }
        QMessageLogger::warning
                  ((char *)local_58.data,
                   "QApplication: invalid style override \'%s\' passed, ignoring it.\n\tAvailable styles: %s"
                   ,local_68,local_80);
        if (local_88 != (QArrayData *)0x0) {
          LOCK();
          (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_88,1,0x10);
          }
        }
        if (local_a0 != (QArrayData *)0x0) {
          LOCK();
          (local_a0->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_a0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_a0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_a0,2,0x10);
          }
        }
        QArrayDataPointer<QString>::~QArrayDataPointer(&QStack_b8);
        if (local_70 != (QArrayData *)0x0) {
          LOCK();
          (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_70,1,0x10);
          }
        }
        QString::clear((QString *)&QGuiApplicationPrivate::styleOverride);
      }
      else {
        QApplication::setStyle(style);
      }
    }
    QApplication::style();
  }
  iVar3 = qEnvironmentVariableIntValue("QT_USE_NATIVE_WINDOWS",(bool *)0x0);
  if (0 < iVar3) {
    QCoreApplication::setAttribute(AA_NativeWindows,true);
  }
  cVar2 = QGuiApplication::desktopSettingsAware();
  if ((cVar2 != '\0') && (QGuiApplicationPrivate::platform_theme != (long *)0x0)) {
    (**(code **)(*QGuiApplicationPrivate::platform_theme + 0x60))
              (&local_58,QGuiApplicationPrivate::platform_theme,0x17);
    enabledAnimations = ::QVariant::toInt((bool *)local_58.data);
    ::QVariant::~QVariant((QVariant *)&local_58);
  }
  QCoreApplicationPrivate::is_app_running._0_1_ = 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QApplicationPrivate::initialize()
{
    is_app_running = false; // Starting up.

    QWidgetPrivate::mapper = new QWidgetMapper;
    QWidgetPrivate::allWidgets = new QWidgetSet;

    // needed for a static build.
    qRegisterWidgetsVariant();

    // needed for widgets in QML
    QAbstractDeclarativeData::setWidgetParent = QWidgetPrivate::setWidgetParentHelper;

    if (application_type != QApplicationPrivate::Tty) {
        if (!styleOverride.isEmpty()) {
            if (auto *style = QStyleFactory::create(styleOverride.toLower())) {
                QApplication::setStyle(style);
            } else {
                qWarning("QApplication: invalid style override '%s' passed, ignoring it.\n"
                    "\tAvailable styles: %s", qPrintable(styleOverride),
                    qPrintable(QStyleFactory::keys().join(", "_L1)));
                // Clear styleOverride so it is not picked by Qt Quick Controls (QTBUG-100563)
                styleOverride.clear();
            }
        }

        // Trigger default style if none was set already
        Q_UNUSED(QApplication::style());
    }

    if (qEnvironmentVariableIntValue("QT_USE_NATIVE_WINDOWS") > 0)
        QCoreApplication::setAttribute(Qt::AA_NativeWindows);

    if (!qt_is_tty_app)
        initializeMultitouch();

    if (QGuiApplication::desktopSettingsAware())
        if (const QPlatformTheme *theme = QGuiApplicationPrivate::platformTheme()) {
            QApplicationPrivate::enabledAnimations = theme->themeHint(QPlatformTheme::UiEffects).toInt();
        }

    is_app_running = true; // no longer starting up
}